

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O1

void __thiscall
duckdb::DataTable::Checkpoint(DataTable *this,TableDataWriter *writer,Serializer *serializer)

{
  RowGroupCollection *pRVar1;
  TableStatistics global_stats;
  TableStatistics local_58;
  
  local_58.column_stats.
  super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.table_sample.
  super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>.
  super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl =
       (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)
       (__uniq_ptr_data<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true,_true>
        )0x0;
  local_58.column_stats.
  super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.column_stats.
  super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.stats_lock.internal.super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58.stats_lock.internal.super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pRVar1 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
  RowGroupCollection::CopyStats(pRVar1,&local_58);
  pRVar1 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
  RowGroupCollection::Checkpoint(pRVar1,writer,&local_58);
  (*writer->_vptr_TableDataWriter[2])
            (writer,&local_58,
             (this->info).internal.
             super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr,serializer
            );
  if (local_58.table_sample.
      super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
      super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
      .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_58.table_sample.
                          super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
                          .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl + 8))
              ();
  }
  local_58.table_sample.
  super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>.
  super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl =
       (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)
       (__uniq_ptr_data<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true,_true>
        )0x0;
  ::std::
  vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ::~vector(&local_58.column_stats.
             super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
           );
  if (local_58.stats_lock.internal.super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.stats_lock.internal.
               super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void DataTable::Checkpoint(TableDataWriter &writer, Serializer &serializer) {
	// checkpoint each individual row group
	TableStatistics global_stats;
	row_groups->CopyStats(global_stats);
	row_groups->Checkpoint(writer, global_stats);
	// The row group payload data has been written. Now write:
	//   sample
	//   column stats
	//   row-group pointers
	//   table pointer
	//   index data
	writer.FinalizeTable(global_stats, info.get(), serializer);
}